

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu384a_com.c
# Opt level: O2

RK_S32 vdpu384a_check_rcb_buf_size(Vdpu384aRcbInfo *info,RK_S32 width,RK_S32 height)

{
  undefined8 in_RAX;
  RK_S32 *pRVar1;
  long lVar2;
  
  pRVar1 = &info->size;
  for (lVar2 = 0; lVar2 != 0x24; lVar2 = lVar2 + 4) {
    if ((int)(*(int *)((long)rcb_coeff + lVar2) * width + 0x3fU & 0xffffffc0) <= *pRVar1) {
      in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),0x46);
      _mpp_log_l(2,"vdpu384a_com","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "info[i].size < (RK_S32)(((width * rcb_coeff[i])+((64))-1)&~(((64))-1))",
                 "vdpu384a_check_rcb_buf_size",in_RAX);
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0025ec89;
    }
    pRVar1 = pRVar1 + 3;
  }
  pRVar1 = &info[9].size;
  lVar2 = 0;
  do {
    if (lVar2 == 2) {
      return 0;
    }
    if ((int)(rcb_coeff[lVar2 + 9] * height + 0x3f & 0xffffffc0) <= *pRVar1) {
      in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),0x49);
      _mpp_log_l(2,"vdpu384a_com","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "info[i].size < (RK_S32)(((height * rcb_coeff[i])+((64))-1)&~(((64))-1))",
                 "vdpu384a_check_rcb_buf_size",in_RAX);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0025ec89:
        abort();
      }
    }
    lVar2 = lVar2 + 1;
    pRVar1 = pRVar1 + 3;
  } while( true );
}

Assistant:

RK_RET vdpu384a_check_rcb_buf_size(Vdpu384aRcbInfo *info, RK_S32 width, RK_S32 height)
{
    RK_U32 i;

    for (i = 0; i < RCB_FILTERD_TILE_COL; i++)
        mpp_assert(info[i].size < (RK_S32)MPP_ALIGN(width * rcb_coeff[i], RCB_ALLINE_SIZE));

    for (i = RCB_FILTERD_TILE_COL; i < RCB_BUF_COUNT; i++)
        mpp_assert(info[i].size < (RK_S32)MPP_ALIGN(height * rcb_coeff[i], RCB_ALLINE_SIZE));

    return MPP_OK;
}